

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O3

int luaV_tostring(lua_State *L,StkId obj)

{
  size_t l;
  GCObject *pGVar1;
  bool bVar2;
  char s [32];
  char acStack_38 [32];
  
  bVar2 = obj->tt == 3;
  if (bVar2) {
    sprintf(acStack_38,"%.14g",(obj->value).gc);
    l = strlen(acStack_38);
    pGVar1 = (GCObject *)luaS_newlstr(L,acStack_38,l);
    (obj->value).gc = pGVar1;
    obj->tt = 4;
  }
  return (uint)bVar2;
}

Assistant:

int luaV_tostring (lua_State *L, StkId obj) {
  if (!ttisnumber(obj))
    return 0;
  else {
    char s[LUAI_MAXNUMBER2STR];
    lua_Number n = nvalue(obj);
    lua_number2str(s, n);
    setsvalue2s(L, obj, luaS_new(L, s));
    return 1;
  }
}